

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_utils.c
# Opt level: O0

void dump_mmt_buf_as_words(mmt_buf *buf)

{
  uint local_14;
  int j;
  mmt_buf *buf_local;
  
  for (local_14 = 0; local_14 < buf->len >> 2; local_14 = local_14 + 1) {
    if (indent_logs == 0) {
      fprintf(_stdout,"LOG:         0x%08x\n",(ulong)buf[(long)(int)local_14 + 1].len);
    }
    else {
      fprintf(_stdout,"%64s        0x%08x\n"," ",(ulong)buf[(long)(int)local_14 + 1].len);
    }
    if (mmt_sync_fd != -1) {
      fflush(_stdout);
    }
  }
  for (local_14 = buf->len & 0xfffffffc; local_14 < buf->len; local_14 = local_14 + 1) {
    if (indent_logs == 0) {
      fprintf(_stdout,"LOG:         0x%02x\n",
              (ulong)*(byte *)((long)&buf[1].len + (long)(int)local_14));
    }
    else {
      fprintf(_stdout,"%64s        0x%02x\n"," ",
              (ulong)*(byte *)((long)&buf[1].len + (long)(int)local_14));
    }
    if (mmt_sync_fd != -1) {
      fflush(_stdout);
    }
  }
  return;
}

Assistant:

void dump_mmt_buf_as_words(struct mmt_buf *buf)
{
	int j;
	for (j = 0; j < buf->len / 4; ++j)
		mmt_log("        0x%08x\n", ((uint32_t *)buf->data)[j]);
	for (j = buf->len / 4 * 4; j < buf->len; ++j)
		mmt_log("        0x%02x\n", buf->data[j]);
}